

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execBsr<(moira::Instr)33,(moira::Mode)12,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 addr;
  Moira *in_RDI;
  AEStackFrame AVar2;
  bool error;
  u32 retpc;
  u32 newpc;
  i16 offset;
  u32 in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd8;
  u32 in_stack_ffffffffffffffdc;
  Moira *in_stack_ffffffffffffffe0;
  undefined8 uVar3;
  
  addr = (in_RDI->reg).pc + (int)(short)(in_RDI->queue).irc;
  bVar1 = misaligned<(moira::Size)2>(in_RDI,addr);
  if (bVar1) {
    AVar2 = makeFrame<0ul>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    uVar3 = AVar2._4_8_;
    AVar2.addr = AVar2._0_4_;
    AVar2._0_4_ = in_stack_ffffffffffffffd8;
    AVar2.ird = (short)uVar3;
    AVar2.sr = (short)((ulong)uVar3 >> 0x10);
    AVar2.pc = (int)((ulong)uVar3 >> 0x20);
    execAddressError(in_RDI,AVar2,in_stack_ffffffffffffffcc);
  }
  else {
    (*in_RDI->_vptr_Moira[0x19])(in_RDI,2);
    push<(moira::Size)4,0ul>(in_RDI,in_stack_ffffffffffffffcc,(bool *)0x25f94a);
    if ((in_stack_ffffffffffffffd8 & 0x1000000) == 0) {
      (in_RDI->reg).pc = addr;
      fullPrefetch<4ul,0>(in_stack_ffffffffffffffe0);
    }
  }
  return;
}

Assistant:

void
Moira::execBsr(u16 opcode)
{
    i16 offset = S == Word ? (i16)queue.irc : (i8)opcode;
    u32 newpc = reg.pc + offset;
    u32 retpc = reg.pc + (S == Word ? 2 : 0);

    // Check for address error
    if (misaligned<Word>(newpc)) {
        execAddressError(makeFrame(newpc));
        return;
    }
    
    // Save return address on stack
    sync(2);
    bool error;
    push <Long> (retpc, error);
    if (error) return;
    
    // Jump to new address
    reg.pc = newpc;

    fullPrefetch<POLLIPL>();
}